

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_read_pcm_frames_s32(ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int32 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  ma_uint64 mVar3;
  byte *pbVar4;
  ulong uVar5;
  uint shift;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ma_int32 *pmVar10;
  ulong uVar11;
  long lVar12;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint j;
  ma_uint64 mVar16;
  ma_int16 samples16 [2048];
  undefined8 local_1038;
  
  if (framesToRead == 0 || pWav == (ma_dr_wav *)0x0) goto LAB_0014969b;
  if (pBufferOut == (ma_int32 *)0x0) {
    mVar16 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,(void *)0x0);
    return mVar16;
  }
  mVar16 = 0;
  switch(pWav->translatedFormatTag) {
  case 1:
    memset(&local_1038,0,0x1000);
    uVar1 = pWav->bitsPerSample;
    if (uVar1 == 0x20) {
      mVar16 = ma_dr_wav_read_pcm_frames(pWav,framesToRead,pBufferOut);
      return mVar16;
    }
    if ((uVar1 & 7) == 0) {
      uVar6 = (uint)(pWav->fmt).channels * (uint)uVar1 >> 3;
    }
    else {
      uVar6 = (uint)(pWav->fmt).blockAlign;
    }
    if (uVar6 != 0) {
      uVar1 = pWav->channels;
      uVar8 = (ulong)uVar6 / (ulong)uVar1;
      if (uVar6 < uVar1) {
        return 0;
      }
      if (uVar6 % (uint)uVar1 != 0) {
        return 0;
      }
      mVar16 = 0;
      uVar2 = (uint)uVar8;
      do {
        uVar11 = 0x1000 / (ulong)uVar6;
        if (framesToRead < 0x1000 / (ulong)uVar6) {
          uVar11 = framesToRead;
        }
        mVar3 = ma_dr_wav_read_pcm_frames(pWav,uVar11,&local_1038);
        if (mVar3 == 0) {
          return mVar16;
        }
        uVar11 = pWav->channels * mVar3;
        if (0x1000 < uVar11 * uVar8) {
          return mVar16;
        }
        switch(uVar2) {
        case 1:
          if (uVar11 != 0 && pBufferOut != (ma_int32 *)0x0) {
            lVar9 = 0;
            do {
              pBufferOut[lVar9] = (*(byte *)((long)&local_1038 + lVar9) ^ 0xffffff80) << 0x18;
              lVar9 = lVar9 + 1;
            } while (uVar11 - lVar9 != 0);
          }
          break;
        case 2:
          if (uVar11 != 0 && pBufferOut != (ma_int32 *)0x0) {
            lVar9 = 0;
            do {
              pBufferOut[lVar9] = (uint)*(ushort *)((long)&local_1038 + lVar9 * 2) << 0x10;
              lVar9 = lVar9 + 1;
            } while (uVar11 - lVar9 != 0);
          }
          break;
        case 3:
          if (uVar11 != 0 && pBufferOut != (ma_int32 *)0x0) {
            pbVar4 = (byte *)((long)&local_1038 + 2);
            lVar9 = 0;
            do {
              pBufferOut[lVar9] = (uint)*pbVar4 << 0x18 | (uint)*(ushort *)(pbVar4 + -2) << 8;
              lVar9 = lVar9 + 1;
              pbVar4 = pbVar4 + 3;
            } while (uVar11 - lVar9 != 0);
          }
          break;
        case 4:
          if (uVar11 != 0) {
            uVar5 = 0;
            do {
              pBufferOut[uVar5] = *(ma_int32 *)((long)&local_1038 + uVar5 * 4);
              uVar5 = uVar5 + 1;
            } while ((uVar5 & 0xffffffff) <= uVar11 && uVar11 - (uVar5 & 0xffffffff) != 0);
          }
          break;
        default:
          if (uVar2 < 9) {
            if (uVar11 != 0) {
              uVar5 = 0;
              puVar13 = &local_1038;
              pmVar10 = pBufferOut;
              do {
                lVar9 = 0;
                uVar14 = 0;
                uVar15 = uVar8;
                iVar7 = uVar2 * -8 + 0x40;
                do {
                  uVar14 = uVar14 | (ulong)*(byte *)((long)puVar13 + lVar9) << ((byte)iVar7 & 0x3f);
                  iVar7 = iVar7 + 8;
                  lVar9 = lVar9 + 1;
                  uVar15 = uVar15 - 1;
                } while (uVar15 != 0);
                puVar13 = (undefined8 *)((long)puVar13 + uVar8);
                *pmVar10 = (ma_int32)(uVar14 >> 0x20);
                pmVar10 = pmVar10 + 1;
                uVar5 = (ulong)((int)uVar5 + 1);
              } while (uVar5 <= uVar11 && uVar11 - uVar5 != 0);
            }
          }
          else {
            memset(pBufferOut,0,uVar11 * 4);
          }
        }
        pBufferOut = pBufferOut + uVar11;
        mVar16 = mVar16 + mVar3;
        framesToRead = framesToRead - mVar3;
      } while (framesToRead != 0);
      return mVar16;
    }
    goto LAB_0014969b;
  case 3:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar6 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
    }
    else {
      uVar6 = (uint)(pWav->fmt).blockAlign;
    }
    if (uVar6 != 0) {
      uVar1 = pWav->channels;
      uVar2 = uVar6 / uVar1;
      if (uVar6 < uVar1) {
        return 0;
      }
      if (uVar6 % (uint)uVar1 != 0) {
        return 0;
      }
      mVar16 = 0;
      do {
        uVar8 = 0x1000 / (ulong)uVar6;
        if (framesToRead < 0x1000 / (ulong)uVar6) {
          uVar8 = framesToRead;
        }
        mVar3 = ma_dr_wav_read_pcm_frames(pWav,uVar8,&local_1038);
        if (mVar3 == 0) {
          return mVar16;
        }
        lVar9 = pWav->channels * mVar3;
        if (0x1000 < lVar9 * (ulong)uVar2) {
          return mVar16;
        }
        if (uVar2 == 8) {
          if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
            lVar12 = 0;
            do {
              pBufferOut[lVar12] = (int)((double)(&local_1038)[lVar12] * 2147483648.0);
              lVar12 = lVar12 + 1;
            } while (lVar9 - lVar12 != 0);
          }
        }
        else if (uVar2 == 4) {
          if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
            lVar12 = 0;
            do {
              pBufferOut[lVar12] = (int)(*(float *)((long)&local_1038 + lVar12 * 4) * 2.1474836e+09)
              ;
              lVar12 = lVar12 + 1;
            } while (lVar9 - lVar12 != 0);
          }
        }
        else {
          memset(pBufferOut,0,lVar9 * 4);
        }
        pBufferOut = pBufferOut + lVar9;
        mVar16 = mVar16 + mVar3;
        framesToRead = framesToRead - mVar3;
      } while (framesToRead != 0);
      return mVar16;
    }
LAB_0014969b:
    mVar16 = 0;
    break;
  case 4:
  case 5:
    break;
  case 6:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar1 = (pWav->fmt).channels;
      uVar6 = (uint)pWav->bitsPerSample * (uint)uVar1 >> 3;
    }
    else {
      uVar6 = (uint)(pWav->fmt).blockAlign;
      uVar1 = (pWav->fmt).channels;
    }
    mVar16 = 0;
    if ((uVar6 != 0) && (uVar6 == uVar1)) {
      uVar1 = pWav->channels;
      mVar16 = 0;
      if ((uVar1 <= uVar6) && ((short)((uVar6 & 0xffff) % (uint)uVar1) == 0)) {
        mVar16 = 0;
        uVar8 = (ulong)(ushort)(0x1000 / (uVar6 & 0xffff));
        do {
          uVar11 = uVar8;
          if (framesToRead < uVar8) {
            uVar11 = framesToRead;
          }
          mVar3 = ma_dr_wav_read_pcm_frames(pWav,uVar11,&local_1038);
          if (mVar3 == 0) {
            return mVar16;
          }
          lVar9 = pWav->channels * mVar3;
          if (0x1000 < lVar9 * (ulong)(ushort)((uVar6 & 0xffff) / (uint)uVar1)) {
            return mVar16;
          }
          if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
            lVar12 = 0;
            do {
              pBufferOut[lVar12] =
                   (uint)g_ma_dr_wavAlawTable[*(byte *)((long)&local_1038 + lVar12)] << 0x10;
              lVar12 = lVar12 + 1;
            } while (lVar9 - lVar12 != 0);
          }
          pBufferOut = pBufferOut + lVar9;
          mVar16 = mVar16 + mVar3;
          framesToRead = framesToRead - mVar3;
        } while (framesToRead != 0);
      }
    }
    break;
  case 7:
    memset(&local_1038,0,0x1000);
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar1 = (pWav->fmt).channels;
      uVar6 = (uint)pWav->bitsPerSample * (uint)uVar1 >> 3;
    }
    else {
      uVar6 = (uint)(pWav->fmt).blockAlign;
      uVar1 = (pWav->fmt).channels;
    }
    mVar16 = 0;
    if ((uVar6 != 0) && (mVar16 = 0, uVar6 == uVar1)) {
      uVar1 = pWav->channels;
      mVar16 = 0;
      if ((uVar1 <= uVar6) && ((short)((uVar6 & 0xffff) % (uint)uVar1) == 0)) {
        mVar16 = 0;
        uVar8 = (ulong)(ushort)(0x1000 / (uVar6 & 0xffff));
        do {
          uVar11 = uVar8;
          if (framesToRead < uVar8) {
            uVar11 = framesToRead;
          }
          mVar3 = ma_dr_wav_read_pcm_frames(pWav,uVar11,&local_1038);
          if (mVar3 == 0) {
            return mVar16;
          }
          lVar9 = pWav->channels * mVar3;
          if (0x1000 < lVar9 * (ulong)(ushort)((uVar6 & 0xffff) / (uint)uVar1)) {
            return mVar16;
          }
          if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
            lVar12 = 0;
            do {
              pBufferOut[lVar12] =
                   (uint)g_ma_dr_wavMulawTable[*(byte *)((long)&local_1038 + lVar12)] << 0x10;
              lVar12 = lVar12 + 1;
            } while (lVar9 - lVar12 != 0);
          }
          pBufferOut = pBufferOut + lVar9;
          mVar16 = mVar16 + mVar3;
          framesToRead = framesToRead - mVar3;
        } while (framesToRead != 0);
      }
    }
    break;
  default:
    if (pWav->translatedFormatTag != 0x11) {
      return 0;
    }
  case 2:
    uVar8 = (ulong)pWav->channels;
    mVar16 = 0;
    do {
      uVar8 = (ulong)(ushort)(0x800 / (ushort)uVar8);
      if (framesToRead < uVar8) {
        uVar8 = framesToRead;
      }
      mVar3 = ma_dr_wav_read_pcm_frames_s16(pWav,uVar8,(ma_int16 *)&local_1038);
      if (mVar3 == 0) {
        return mVar16;
      }
      uVar8 = (ulong)pWav->channels;
      lVar9 = mVar3 * uVar8;
      if (lVar9 != 0 && pBufferOut != (ma_int32 *)0x0) {
        lVar12 = 0;
        do {
          pBufferOut[lVar12] = (uint)*(ushort *)((long)&local_1038 + lVar12 * 2) << 0x10;
          lVar12 = lVar12 + 1;
        } while (lVar9 - lVar12 != 0);
      }
      pBufferOut = pBufferOut + lVar9;
      mVar16 = mVar16 + mVar3;
      framesToRead = framesToRead - mVar3;
    } while (framesToRead != 0);
    return mVar16;
  }
  return mVar16;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s32(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int32* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(ma_int32) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(ma_int32) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_s32__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s32__msadpcm_ima(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_s32__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_s32__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_s32__mulaw(pWav, framesToRead, pBufferOut);
    }
    return 0;
}